

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::EnumDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  _func_int **pp_Var2;
  MessageLite *from_msg_00;
  string *psVar3;
  EnumOptions *pEVar4;
  size_type sVar5;
  Arena *arena;
  undefined8 uVar6;
  char *pcVar7;
  Arena *arena_00;
  EnumDescriptorProto *_this;
  EnumDescriptorProto *local_28 [2];
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  _this = (EnumDescriptorProto *)to_msg;
  local_28[0] = (EnumDescriptorProto *)from_msg;
  psVar3 = absl::lts_20240722::log_internal::
           Check_NEImpl<google::protobuf::EnumDescriptorProto_const*,google::protobuf::EnumDescriptorProto*>
                     (local_28,&_this,"&from != _this");
  if (psVar3 == (string *)0x0) {
    RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::MergeFrom
              (&(_this->field_0)._impl_.value_,
               (RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)
               &from_msg[1]._internal_metadata_);
    RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::MergeFrom
              (&(_this->field_0)._impl_.reserved_range_,
               (RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)
               (from_msg + 3));
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::MergeFrom(&(_this->field_0)._impl_.reserved_name_,
                (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&from_msg[4]._internal_metadata_);
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        pp_Var2 = from_msg[6]._vptr_MessageLite;
        (_this->field_0)._impl_._has_bits_.has_bits_[0] =
             (_this->field_0)._impl_._has_bits_.has_bits_[0] | 1;
        arena = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  (&(_this->field_0)._impl_.name_,(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),
                   arena);
      }
      if ((uVar1 & 2) != 0) {
        from_msg_00 = (MessageLite *)from_msg[6]._internal_metadata_.ptr_;
        if (from_msg_00 == (MessageLite *)0x0) {
          pcVar7 = "from._impl_.options_ != nullptr";
          sVar5 = 0x1f;
          uVar6 = 0x1b3c;
          goto LAB_0020316f;
        }
        pEVar4 = (_this->field_0)._impl_.options_;
        if (pEVar4 == (EnumOptions *)0x0) {
          pEVar4 = (EnumOptions *)
                   Arena::CopyConstruct<google::protobuf::EnumOptions>(arena_00,from_msg_00);
          (_this->field_0)._impl_.options_ = pEVar4;
        }
        else {
          EnumOptions::MergeImpl((MessageLite *)pEVar4,from_msg_00);
        }
      }
    }
    (_this->field_0)._impl_._has_bits_.has_bits_[0] =
         (_this->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(_this->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  pcVar7 = (psVar3->_M_dataplus)._M_p;
  sVar5 = psVar3->_M_string_length;
  uVar6 = 0x1b2d;
LAB_0020316f:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
             ,uVar6,sVar5,pcVar7);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void EnumDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumDescriptorProto*>(&to_msg);
  auto& from = static_cast<const EnumDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_value()->MergeFrom(
      from._internal_value());
  _this->_internal_mutable_reserved_range()->MergeFrom(
      from._internal_reserved_range());
  _this->_internal_mutable_reserved_name()->MergeFrom(from._internal_reserved_name());
  cached_has_bits = from._impl_._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _this->_internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ =
            ::google::protobuf::Message::CopyConstruct<::google::protobuf::EnumOptions>(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}